

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.h
# Opt level: O0

pointer_type
cppcms::impl::mfunc_to_event_handler<cppcms::impl::tcp_pipe,std::shared_ptr<cppcms::impl::tcp_pipe>>
          (offset_in_tcp_pipe_to_subr f,shared_ptr<cppcms::impl::tcp_pipe> *s)

{
  event_handler_binder_p0<void_(cppcms::impl::tcp_pipe::*)(const_std::error_code_&),_std::shared_ptr<cppcms::impl::tcp_pipe>_>
  *in_RCX;
  shared_ptr<cppcms::impl::tcp_pipe> *in_RDI;
  shared_ptr<cppcms::impl::tcp_pipe> *p;
  
  p = in_RDI;
  operator_new(0x30);
  event_handler_binder_p0<void_(cppcms::impl::tcp_pipe::*)(const_std::error_code_&),_std::shared_ptr<cppcms::impl::tcp_pipe>_>
  ::event_handler_binder_p0(in_RCX,(offset_in_tcp_pipe_to_subr *)p,in_RDI);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::intrusive_ptr
            ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)in_RCX,
             (callable<void_(const_std::error_code_&)> *)p,SUB81((ulong)in_RDI >> 0x38,0));
  return (pointer_type)(callable<void_(const_std::error_code_&)> *)p;
}

Assistant:

booster::aio::event_handler::pointer_type mfunc_to_event_handler(void (C::*f)(booster::system::error_code const &e),S s)
{
	return new event_handler_binder_p0<void (C::*)(booster::system::error_code const &),S>(f,s);
}